

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O1

int __thiscall
xercesc_4_0::BMPattern::matches(BMPattern *this,XMLCh *content,XMLSize_t start,XMLSize_t limit)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  size_t __n;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ArrayJanitor<char16_t> janUCContent;
  int local_58;
  ArrayJanitor<char16_t> local_40;
  XMLCh *toUpperCase;
  
  lVar6 = 0;
  if (this->fPattern != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPattern + lVar6);
      lVar6 = lVar6 + 2;
    } while (*psVar1 != 0);
    lVar6 = (lVar6 >> 1) + -1;
  }
  if (lVar6 == 0) {
    local_58 = (int)start;
  }
  else {
    if (this->fIgnoreCase == true) {
      if (content == (XMLCh *)0x0) {
        toUpperCase = (XMLCh *)0x0;
      }
      else {
        __n = 0;
        do {
          psVar1 = (short *)((long)content + __n);
          __n = __n + 2;
        } while (*psVar1 != 0);
        iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
        toUpperCase = (XMLCh *)CONCAT44(extraout_var,iVar3);
        memcpy(toUpperCase,content,__n);
      }
      XMLString::upperCase(toUpperCase);
    }
    else {
      toUpperCase = (char16_t *)0x0;
    }
    ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toUpperCase,this->fMemoryManager);
    uVar7 = start + lVar6;
    do {
      if (limit < uVar7) {
        local_58 = -1;
        break;
      }
      uVar4 = uVar7 - lVar6;
      lVar5 = 0;
      do {
        if ((content[uVar7 + lVar5 + -1] != this->fPattern[lVar6 + lVar5 + -1]) &&
           (((this->fIgnoreCase & 1U) == 0 ||
            (this->fUppercasePattern[lVar6 + lVar5 + -1] != toUpperCase[uVar7 + lVar5 + -1])))) {
          uVar4 = uVar7 + this->fShiftTable
                          [(ulong)(ushort)content[uVar7 + lVar5 + -1] % (ulong)this->fShiftTableLen]
                  + lVar5;
          if (uVar4 <= uVar7 + 1) {
            uVar4 = uVar7 + 1;
          }
          bVar2 = true;
          goto LAB_0023ebc7;
        }
        lVar5 = lVar5 + -1;
      } while (-lVar5 != lVar6);
      bVar2 = false;
      local_58 = (int)uVar4;
LAB_0023ebc7:
      uVar7 = uVar4;
    } while (bVar2);
    ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
  }
  return local_58;
}

Assistant:

int BMPattern::matches(const XMLCh* const content, XMLSize_t start, XMLSize_t limit) const {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    // Uppercase Content
    XMLCh* ucContent = 0;

    if (patternLen == 0)
        return (int)start;

    if (fIgnoreCase) {
        
        ucContent = XMLString::replicate(content, fMemoryManager);
        XMLString::upperCase(ucContent);
    }

    ArrayJanitor<XMLCh> janUCContent(ucContent, fMemoryManager);

    XMLSize_t index = start + patternLen;

    while (index <= limit) {

        XMLSize_t patternIndex = patternLen;
        XMLSize_t nIndex = index + 1;
        XMLCh ch = 0;

        while (patternIndex > 0) {

            ch = content[--index];

            if (ch != fPattern[--patternIndex]) {

                // No match, so we will break. But first we have
                // to check the ignore case flag. If it is set, then
                // we try to match with the case ignored
                if (!fIgnoreCase ||
                    (fUppercasePattern[patternIndex] != ucContent[index]))
                    break;
            }

            if (patternIndex == 0)
                return (int)index;
        }

        index += fShiftTable[ch % fShiftTableLen] + 1;

        if (index < nIndex)
            index = nIndex;
    }

    return -1;
}